

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O1

void anon_unknown.dwarf_353df4::check<signed_char>(istream *is,char c)

{
  undefined1 uVar1;
  undefined8 in_RAX;
  size_t sVar2;
  ostream *poVar3;
  char *__s;
  char v;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::istream::read((char *)is,(long)&uStack_28 + 5);
  __s = _hasAperture + (*_hasAperture == '*');
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": expected ",0xb);
  uStack_28._0_7_ = CONCAT16(c,(undefined6)uStack_28);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)((long)&uStack_28 + 6),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", got ",6);
  uVar1 = uStack_28._5_1_;
  uStack_28 = CONCAT17(uVar1,(undefined7)uStack_28);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)((long)&uStack_28 + 7),1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (uStack_28._5_1_ == c) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = signed char]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}